

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::sf_store(Forth *this)

{
  uint uVar1;
  long lVar2;
  float value1;
  float local_2c;
  double local_28;
  
  requireDStackDepth(this,1,"SF!");
  requireFStackDepth(this,1,"SF!");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  local_28 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  local_2c = (float)local_28;
  lVar2 = 0;
  do {
    dataSpaceSet(this,uVar1 + (int)lVar2,*(Char *)((long)&local_2c + lVar2));
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

void sf_store() {
			REQUIRE_DSTACK_DEPTH(1, "SF!");
			REQUIRE_FSTACK_DEPTH(1, "SF!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "SF!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell32(aaddr, x);
		}